

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O2

REF_STATUS ref_subdiv_mark_prism_by_metric(REF_SUBDIV ref_subdiv)

{
  REF_INT node0;
  REF_INT node1;
  REF_NODE ref_node;
  REF_CELL pRVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  REF_DBL ratio;
  double local_38;
  
  ref_node = ref_subdiv->grid->node;
  pRVar1 = ref_subdiv->grid->cell[10];
  iVar3 = 0;
  do {
    if (pRVar1->max <= iVar3) {
      return 0;
    }
    if (pRVar1->c2n[(long)pRVar1->size_per * (long)iVar3] != -1) {
      for (lVar5 = 0; lVar5 != 0x18; lVar5 = lVar5 + 4) {
        lVar4 = (long)pRVar1->size_per * (long)iVar3;
        node0 = pRVar1->c2n[pRVar1->e2n[(long)*(int *)((long)&DAT_00205e60 + lVar5) * 2] + lVar4];
        node1 = pRVar1->c2n
                [(long)(int)lVar4 + (long)pRVar1->e2n[*(int *)((long)&DAT_00205e60 + lVar5) * 2 + 1]
                ];
        uVar2 = ref_node_ratio(ref_node,node0,node1,&local_38);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xf2,"ref_subdiv_mark_prism_by_metric",(ulong)uVar2,"ratio");
          return uVar2;
        }
        if ((1.4142135623730951 < local_38) &&
           (uVar2 = ref_subdiv_mark_to_split(ref_subdiv,node0,node1), uVar2 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0xf4,"ref_subdiv_mark_prism_by_metric",(ulong)uVar2,"sp");
          return uVar2;
        }
      }
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_mark_prism_by_metric(REF_SUBDIV ref_subdiv) {
  REF_NODE ref_node = ref_grid_node(ref_subdiv_grid(ref_subdiv));
  REF_CELL ref_cell = ref_grid_pri(ref_subdiv_grid(ref_subdiv));
  REF_INT cell, cell_edge;
  REF_INT node0, node1;
  REF_DBL ratio, ratio_limit;

  REF_INT tri_cell_edge;
  REF_INT pri_tri_cell_edge[] = {0, 1, 3, 6, 7, 8};

  ratio_limit = sqrt(2.0);

  each_ref_cell_valid_cell(ref_cell, cell) {
    for (tri_cell_edge = 0; tri_cell_edge < 6; tri_cell_edge++) {
      cell_edge = pri_tri_cell_edge[tri_cell_edge];
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      RSS(ref_node_ratio(ref_node, node0, node1, &ratio), "ratio");
      if (ratio > ratio_limit)
        RSS(ref_subdiv_mark_to_split(ref_subdiv, node0, node1), "sp");
    }
  }

  return REF_SUCCESS;
}